

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

qpdf_oh qpdf_oh_get_dict(qpdf_data qpdf,qpdf_oh oh)

{
  uint uVar1;
  anon_class_8_1_8990bbdf local_60;
  function<unsigned_int_(QPDFObjectHandle_&)> local_58;
  function<unsigned_int_()> local_38;
  qpdf_oh local_14;
  qpdf_data p_Stack_10;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  local_14 = oh;
  p_Stack_10 = qpdf;
  return_null(&local_38,qpdf);
  local_60.qpdf = p_Stack_10;
  std::function<unsigned_int(QPDFObjectHandle&)>::function<qpdf_oh_get_dict::__0,void>
            ((function<unsigned_int(QPDFObjectHandle&)> *)&local_58,&local_60);
  uVar1 = do_with_oh<unsigned_int>(qpdf,oh,&local_38,&local_58);
  std::function<unsigned_int_(QPDFObjectHandle_&)>::~function(&local_58);
  std::function<unsigned_int_()>::~function(&local_38);
  return uVar1;
}

Assistant:

qpdf_oh
qpdf_oh_get_dict(qpdf_data qpdf, qpdf_oh oh)
{
    return do_with_oh<qpdf_oh>(qpdf, oh, return_null(qpdf), [qpdf](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_get_dict");
        return new_object(qpdf, o.getDict());
    });
}